

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_true>::
SetProperty_Internal<true>
          (SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_true> *this,
          DynamicObject *instance,PropertyId propertyId,Var value,PropertyOperationFlags flags,
          PropertyValueInfo *info)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  uint32 index;
  undefined4 *puVar4;
  PropertyRecord *propertyKey;
  undefined4 in_register_00000084;
  SimpleDictionaryPropertyDescriptor<unsigned_short> *local_50;
  SimpleDictionaryPropertyDescriptor<unsigned_short> *descriptor;
  PropertyRecord *propertyRecord;
  undefined8 local_38;
  
  local_38 = CONCAT44(in_register_00000084,flags);
  propertyRecord = (PropertyRecord *)info;
  if (propertyId == -1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x4f9,"(propertyId != Constants::NoProperty)",
                                "propertyId != Constants::NoProperty");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  propertyKey = ScriptContext::GetPropertyName
                          ((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)
                           ->super_JavascriptLibraryBase).scriptContext.ptr,propertyId);
  descriptor = (SimpleDictionaryPropertyDescriptor<unsigned_short> *)propertyKey;
  JavascriptLibrary::CheckAndInvalidateIsConcatSpreadableCache
            (propertyId,
             (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).scriptContext.ptr);
  if ((propertyKey->isSymbol == false) &&
     (bVar2 = JsUtil::
              BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
              ::TryGetReference<Js::PropertyRecord_const*>
                        ((BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
                          *)(this->propertyMap).ptr,(PropertyRecord **)&descriptor,&local_50),
     propertyKey = (PropertyRecord *)descriptor, bVar2)) {
    BVar3 = SimpleDictionaryTypeHandlerBase<unsigned_short,Js::JavascriptString*,true>::
            SetPropertyFromDescriptor<true,int>
                      ((SimpleDictionaryTypeHandlerBase<unsigned_short,Js::JavascriptString*,true> *
                       )this,instance,propertyId,propertyId,local_50,value,
                       (PropertyOperationFlags)local_38,(PropertyValueInfo *)propertyRecord);
  }
  else if (propertyKey->isNumeric == true) {
    index = PropertyRecord::GetNumericValue(propertyKey);
    BVar3 = SetItem(this,instance,index,value,(PropertyOperationFlags)local_38);
  }
  else {
    BVar3 = SimpleDictionaryTypeHandlerBase<unsigned_short,Js::JavascriptString*,true>::
            AddProperty<Js::PropertyRecord_const*>
                      ((SimpleDictionaryTypeHandlerBase<unsigned_short,Js::JavascriptString*,true> *
                       )this,instance,propertyKey,value,'\a',(PropertyValueInfo *)propertyRecord,
                       (PropertyOperationFlags)local_38,SideEffects_Any);
  }
  return BVar3;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::SetProperty_Internal(DynamicObject* instance, PropertyId propertyId, Var value, PropertyOperationFlags flags, PropertyValueInfo* info)
    {
        SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor;

        Assert(propertyId != Constants::NoProperty);
        PropertyRecord const* propertyRecord = instance->GetScriptContext()->GetPropertyName(propertyId);

        JavascriptLibrary::CheckAndInvalidateIsConcatSpreadableCache(propertyId, instance->GetScriptContext());

        // It can be the case that propertyRecord is a symbol property and it has the same string description as
        // another property which is in the propertyMap. If we are in a string-keyed type handler, the propertyMap
        // will find that normal property when we call TryGetReference with the symbol propertyRecord. However,
        // we don't want to update that descriptor with value since the two properties are actually different.
        // In fact, we can't store a symbol in a string-keyed type handler at all since the string description
        // is not used for symbols. Instead, we want to skip searching for the descriptor if we are in a string-keyed
        // type handler. When we call AddProperty with the symbol propertyRecord, it should convert us to a
        // const PropertyRecord* - keyed type handler anyway.
        if (!(TMapKey_IsJavascriptString<TMapKey>() && propertyRecord->IsSymbol())
            && propertyMap->TryGetReference(propertyRecord, &descriptor))
        {
            return SetPropertyFromDescriptor<allowLetConstGlobal>(instance, propertyId, propertyId, descriptor, value, flags, info);
        }

        // Always check numeric propertyId. This may create objectArray.
        if (propertyRecord->IsNumeric())
        {
            return this->SetItem(instance, propertyRecord->GetNumericValue(), value, flags);
        }

        return this->AddProperty(instance, propertyRecord, value, PropertyDynamicTypeDefaults, info, flags, SideEffects_Any);
    }